

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O3

wchar_t fmt_title(char *buf,wchar_t max,_Bool short_mode)

{
  _Bool _Var1;
  size_t sVar2;
  char *src;
  
  *buf = '\0';
  if (player->wizard == true) {
    src = "[=-WIZARD-=]";
  }
  else if ((player->total_winner == 0) && (player->lev < 0x33)) {
    _Var1 = player_is_shapechanged(player);
    if (_Var1) {
      my_strcpy(buf,player->shape->name,0x20);
      my_strcap(buf);
      goto LAB_001c21ce;
    }
    if ((char)max != '\0') goto LAB_001c21ce;
    src = player->class->title[(player->lev + -1) / 5];
  }
  else {
    src = "***WINNER***";
  }
  my_strcpy(buf,src,0x20);
LAB_001c21ce:
  sVar2 = strlen(buf);
  return (wchar_t)sVar2;
}

Assistant:

static int fmt_title(char buf[], int max, bool short_mode)
{
	buf[0] = 0;

	/* Wizard, winner or neither */
	if (player->wizard) {
		my_strcpy(buf, "[=-WIZARD-=]", max);
	} else if (player->total_winner || (player->lev > PY_MAX_LEVEL)) {
		my_strcpy(buf, "***WINNER***", max);
	} else if (player_is_shapechanged(player)) {		
		my_strcpy(buf, player->shape->name, max);
		my_strcap(buf);		
	} else if (!short_mode) {
		my_strcpy(buf, player->class->title[(player->lev - 1) / 5], max);
	}

	return strlen(buf);
}